

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt-base.h
# Opt level: O0

VCString * __thiscall mp::pre::VCString::operator+(VCString *this,char (*arg) [6])

{
  VCString *in_RDI;
  string *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  
  std::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  VCString(in_RDI,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return in_RDI;
}

Assistant:

VCString operator+(const T& arg) const
  { return {s_ + arg}; }